

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx::destroy_pipeline
          (DeconvolutionDepthWise_x86_avx *this,Option *opt)

{
  size_type sVar1;
  reference ppLVar2;
  undefined8 in_RSI;
  long in_RDI;
  int i;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 8));
    if ((int)sVar1 <= local_14) break;
    ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 8),
                         (long)local_14);
    (*(*ppLVar2)->_vptr_Layer[5])(*ppLVar2,in_RSI);
    ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 8),
                         (long)local_14);
    if (*ppLVar2 != (value_type)0x0) {
      (*(*ppLVar2)->_vptr_Layer[1])();
    }
    local_14 = local_14 + 1;
  }
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::clear
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x19a4a4b);
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86_avx::destroy_pipeline(const Option& opt)
{
    for (int i = 0; i < (int)group_ops.size(); i++)
    {
        group_ops[i]->destroy_pipeline(opt);
        delete group_ops[i];
    }
    group_ops.clear();

    return 0;
}